

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ConditionalConstraint * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ConditionalConstraint,slang::ast::Expression_const&,slang::ast::Constraint_const&,slang::ast::Constraint_const*&>
          (BumpAllocator *this,Expression *args,Constraint *args_1,Constraint **args_2)

{
  ConditionalConstraint *elseBody;
  Constraint *in_RCX;
  Expression *in_RDX;
  ConditionalConstraint *in_RSI;
  BumpAllocator *in_RDI;
  
  elseBody = (ConditionalConstraint *)allocate(in_RDI,(size_t)in_RSI,(size_t)in_RDX);
  ast::ConditionalConstraint::ConditionalConstraint(in_RSI,in_RDX,in_RCX,(Constraint *)elseBody);
  return elseBody;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }